

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogLuvDecode24(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  uint8_t *puVar1;
  bool bVar2;
  long lVar3;
  undefined6 in_register_0000000a;
  byte *pbVar4;
  uint8_t *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x10e,"int LogLuvDecode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar1 = tif->tif_data;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x10f,"int LogLuvDecode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = occ / (long)*(int *)(puVar1 + 0xc);
  puVar5 = op;
  if (*(int *)(puVar1 + 4) != 2) {
    if (*(long *)(puVar1 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogLuvDecode24","Translation buffer too short");
      return 0;
    }
    puVar5 = *(uint8_t **)(puVar1 + 0x10);
  }
  pbVar4 = tif->tif_rawcp;
  lVar7 = tif->tif_rawcc;
  lVar6 = 0;
  lVar8 = lVar7;
  if (2 < lVar7 && 0 < lVar3) {
    do {
      *(uint *)(puVar5 + lVar6 * 4) = (uint)pbVar4[2] | (uint)pbVar4[1] << 8 | (uint)*pbVar4 << 0x10
      ;
      pbVar4 = pbVar4 + 3;
      lVar7 = lVar8 + -3;
      lVar6 = lVar6 + 1;
      if (lVar3 <= lVar6) break;
      bVar2 = 5 < lVar8;
      lVar8 = lVar7;
    } while (bVar2);
  }
  tif->tif_rawcp = pbVar4;
  tif->tif_rawcc = lVar7;
  if (lVar3 != lVar6) {
    TIFFErrorExtR(tif,"LogLuvDecode24","Not enough data at row %u (short %ld pixels)",
                  (ulong)tif->tif_row);
  }
  else {
    (**(code **)(puVar1 + 0x20))(puVar1,op,lVar3);
  }
  return (uint)(lVar3 == lVar6);
}

Assistant:

static int LogLuvDecode24(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode24";
    LogLuvState *sp = DecoderState(tif);
    tmsize_t cc;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    /* copy to array of uint32_t */
    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    for (i = 0; i < npixels && cc >= 3; i++)
    {
        tp[i] = bp[0] << 16 | bp[1] << 8 | bp[2];
        bp += 3;
        cc -= 3;
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (i != npixels)
    {
        TIFFErrorExtR(tif, module,
                      "Not enough data at row %" PRIu32
                      " (short %" TIFF_SSIZE_FORMAT " pixels)",
                      tif->tif_row, npixels - i);
        return (0);
    }
    (*sp->tfunc)(sp, op, npixels);
    return (1);
}